

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  _IO_FILE *in_stack_fffffffffffffb18;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  allocator_type *in_stack_fffffffffffffb30;
  key_equal *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  size_type in_stack_fffffffffffffb48;
  Type TVar5;
  string *s;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  char *in_stack_fffffffffffffb88;
  char *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  AssertHelper *in_stack_fffffffffffffba0;
  AssertionResult local_3e8 [2];
  AssertionResult local_3c8;
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  StringIO local_370;
  string local_368;
  allocator local_331;
  string local_330 [32];
  AssertionResult local_310 [2];
  allocator local_2e9;
  string local_2e8 [32];
  AssertionResult local_2c8 [2];
  int local_2a8;
  undefined4 local_2a4;
  AssertionResult local_2a0 [2];
  size_t local_280;
  AssertionResult local_278;
  char local_268 [48];
  undefined8 local_238;
  AssertionResult local_230;
  size_t local_220;
  string local_218 [55];
  undefined1 local_1e1;
  AssertionResult local_1e0;
  string local_1d0 [55];
  undefined1 local_199;
  AssertionResult local_198;
  string local_188 [55];
  undefined1 local_151;
  AssertionResult local_150;
  FILE *local_140;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [48];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d8;
  Hasher local_c8;
  Hasher local_bc;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  Hasher::Hasher(&local_bc,0);
  Hasher::Hasher(&local_c8,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (hasher *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
             in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  TVar5 = (Type)(in_stack_fffffffffffffb48 >> 0x20);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,anon_var_dwarf_14da82,0x18,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"$hu1",0x14,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  bVar2 = google::
          HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite(&local_b0);
  if (bVar2) {
    local_140 = tmpfile();
    local_151 = local_140 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
               (type *)0xfc8e76);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_188);
      testing::Message::~Message((Message *)0xfc8fc7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc905b);
    local_199 = google::
                BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_metadata<_IO_FILE>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
               (type *)0xfc90a2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_198);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_1d0);
      testing::Message::~Message((Message *)0xfc9177);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc920b);
    local_1e1 = google::
                BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_nopointer_data<_IO_FILE>
                          (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
               (type *)0xfc9252);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_218);
      testing::Message::~Message((Message *)0xfc9327);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc93be);
    local_220 = ftell(local_140);
    rewind(local_140);
    local_238 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (unsigned_long *)in_stack_fffffffffffffb20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_230);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::AssertionResult::failure_message((AssertionResult *)0xfc9473);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xfc94d6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc9547);
    local_280 = fread(local_268,1,local_220,local_140);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (unsigned_long *)in_stack_fffffffffffffb20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffba0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfc95f6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xfc9659);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc96ca);
    local_2a4 = 0xffffffff;
    in_stack_fffffffffffffb9c = fgetc(local_140);
    local_2a8 = in_stack_fffffffffffffb9c;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
               (int *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (int *)in_stack_fffffffffffffb20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb90 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfc976c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xfc97c9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc983a);
    fclose(local_140);
    in_stack_fffffffffffffb84 = (int)local_268[0];
    in_stack_fffffffffffffb88 = (char *)std::__cxx11::string::operator[]((ulong)local_108);
    sVar1 = local_220;
    if (in_stack_fffffffffffffb84 == *in_stack_fffffffffffffb88) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,local_268,sVar1,&local_2e9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        testing::AssertionResult::failure_message((AssertionResult *)0xfc9997);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,
                   (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
        testing::Message::~Message((Message *)0xfc99f4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc9a5f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,local_268,sVar1,&local_331);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_310);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        in_stack_fffffffffffffb50 =
             (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xfc9b7a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),(char *)in_stack_fffffffffffffb30
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,
                   (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
        testing::Message::~Message((Message *)0xfc9bd7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc9c42);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  bVar2 = google::
          HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization(&local_b0);
  if (bVar2) {
    s = &local_368;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_370,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<char_const*>,StringIO>
                      (&local_b0.
                        super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       ,&local_370);
    local_381 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
               (type *)0xfc9cd5);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_380);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                 (char *)CONCAT17(uVar3,in_stack_fffffffffffffb40),iVar4,
                 (char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_3b8);
      testing::Message::~Message((Message *)0xfc9db1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc9e48);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_368);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_108);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb20);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfc9f0b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb40),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,
                   (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfc9f68);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc9fd3);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb20);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        testing::AssertionResult::failure_message((AssertionResult *)0xfca04b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb50,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb40),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,
                   (Message *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
        testing::Message::~Message((Message *)0xfca0a6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfca111);
    }
    std::__cxx11::string::~string((string *)&local_368);
  }
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xfca167);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}